

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editing_commands.cpp
# Opt level: O0

Am_Value cycle_value_get_string_proc(Am_Object *self)

{
  unsigned_short uVar1;
  int value_00;
  Am_Value *pAVar2;
  anon_union_8_8_ea4c8939_for_value extraout_RDX;
  anon_union_8_8_ea4c8939_for_value extraout_RDX_00;
  anon_union_8_8_ea4c8939_for_value aVar3;
  Am_Object *in_RSI;
  Am_Value AVar4;
  undefined1 local_50 [4];
  int cur_val;
  Am_Value v;
  undefined1 local_30 [8];
  Am_Value_List labels;
  Am_Object *self_local;
  Am_Value *value;
  
  labels.item._7_1_ = 0;
  Am_Value::Am_Value((Am_Value *)self);
  pAVar2 = Am_Object::Get(in_RSI,0x1aa,0);
  Am_Value_List::Am_Value_List((Am_Value_List *)local_30,pAVar2);
  Am_Value::Am_Value((Am_Value *)local_50);
  pAVar2 = Am_Object::Peek(in_RSI,0x169,0);
  Am_Value::operator=((Am_Value *)local_50,pAVar2);
  if (local_50._0_2_ == 2) {
    value_00 = Am_Value::operator_cast_to_int((Am_Value *)local_50);
    Am_Object::Set(in_RSI,0x1d4,value_00,0);
    if ((value_00 < 0) ||
       (uVar1 = Am_Value_List::Length((Am_Value_List *)local_30), (int)(uint)uVar1 <= value_00)) {
      Am_Value::operator=((Am_Value *)self,"**ERROR**");
    }
    else {
      pAVar2 = Am_Value_List::Get_Nth((Am_Value_List *)local_30,value_00);
      Am_Value::operator=((Am_Value *)self,pAVar2);
    }
  }
  labels.item._7_1_ = 1;
  Am_Value::~Am_Value((Am_Value *)local_50);
  Am_Value_List::~Am_Value_List((Am_Value_List *)local_30);
  aVar3 = extraout_RDX;
  if ((labels.item._7_1_ & 1) == 0) {
    Am_Value::~Am_Value((Am_Value *)self);
    aVar3 = extraout_RDX_00;
  }
  AVar4.value.wrapper_value = aVar3.wrapper_value;
  AVar4._0_8_ = self;
  return AVar4;
}

Assistant:

Am_Define_Formula(Am_Value, cycle_value_get_string)
{
  Am_Value value;
  Am_Value_List labels = self.Get(Am_LABEL_LIST);
  Am_Value v;
  v = self.Peek(Am_VALUE);
  if (v.type == Am_INT) {
    int cur_val = v;
    self.Set(Am_COMPUTE_INTER_VALUE, cur_val); //keep consistent with value
    if (cur_val < 0 || cur_val >= labels.Length()) {
      value = "**ERROR**";
    } else
      value = labels.Get_Nth(cur_val);
  }
  return value;
}